

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nanosvg.h
# Opt level: O0

void nsvg__parseGradientStop(NSVGparser *p,char **attr)

{
  NSVGgradientData *pNVar1;
  int iVar2;
  NSVGattrib *pNVar3;
  NSVGgradientStop *pNVar4;
  int local_38;
  int local_34;
  int idx;
  int i;
  NSVGgradientStop *stop;
  NSVGgradientData *grad;
  NSVGattrib *curAttr;
  char **attr_local;
  NSVGparser *p_local;
  
  pNVar3 = nsvg__getAttr(p);
  pNVar3->stopOffset = 0.0;
  pNVar3->stopColor = 0;
  pNVar3->stopOpacity = 1.0;
  for (local_34 = 0; attr[local_34] != (char *)0x0; local_34 = local_34 + 2) {
    nsvg__parseAttr(p,attr[local_34],attr[local_34 + 1]);
  }
  pNVar1 = p->gradients;
  if (pNVar1 != (NSVGgradientData *)0x0) {
    pNVar1->nstops = pNVar1->nstops + 1;
    pNVar4 = (NSVGgradientStop *)realloc(pNVar1->stops,(long)pNVar1->nstops << 3);
    pNVar1->stops = pNVar4;
    if (pNVar1->stops != (NSVGgradientStop *)0x0) {
      local_38 = pNVar1->nstops + -1;
      for (local_34 = 0; local_34 < pNVar1->nstops + -1; local_34 = local_34 + 1) {
        if (pNVar3->stopOffset < pNVar1->stops[local_34].offset) {
          local_38 = local_34;
          break;
        }
      }
      if (local_38 != pNVar1->nstops + -1) {
        iVar2 = pNVar1->nstops;
        while (local_34 = iVar2 + -1, local_38 < local_34) {
          pNVar1->stops[local_34] = pNVar1->stops[iVar2 + -2];
          iVar2 = local_34;
        }
      }
      pNVar4 = pNVar1->stops + local_38;
      pNVar4->color = pNVar3->stopColor;
      pNVar4->color = (int)(long)(pNVar3->stopOpacity * 255.0) << 0x18 | pNVar4->color;
      pNVar4->offset = pNVar3->stopOffset;
    }
  }
  return;
}

Assistant:

static void nsvg__parseGradientStop(NSVGparser* p, const char** attr)
{
	NSVGattrib* curAttr = nsvg__getAttr(p);
	NSVGgradientData* grad;
	NSVGgradientStop* stop;
	int i, idx;

	curAttr->stopOffset = 0;
	curAttr->stopColor = 0;
	curAttr->stopOpacity = 1.0f;

	for (i = 0; attr[i]; i += 2) {
		nsvg__parseAttr(p, attr[i], attr[i + 1]);
	}

	// Add stop to the last gradient.
	grad = p->gradients;
	if (grad == NULL) return;

	grad->nstops++;
	grad->stops = (NSVGgradientStop*)realloc(grad->stops, sizeof(NSVGgradientStop)*grad->nstops);
	if (grad->stops == NULL) return;

	// Insert
	idx = grad->nstops-1;
	for (i = 0; i < grad->nstops-1; i++) {
		if (curAttr->stopOffset < grad->stops[i].offset) {
			idx = i;
			break;
		}
	}
	if (idx != grad->nstops-1) {
		for (i = grad->nstops-1; i > idx; i--)
			grad->stops[i] = grad->stops[i-1];
	}

	stop = &grad->stops[idx];
	stop->color = curAttr->stopColor;
	stop->color |= (unsigned int)(curAttr->stopOpacity*255) << 24;
	stop->offset = curAttr->stopOffset;
}